

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O3

void test_21(QPDF *pdf,char *arg2)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  long *plVar1;
  undefined8 uVar2;
  void *unaff_R14;
  QPDFObjectHandle page;
  QPDFObjectHandle contents;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  string local_50 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  long *local_40 [2];
  long local_30 [3];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  plVar1 = (long *)QPDF::getAllPages();
  if (plVar1[1] != *plVar1) {
    this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*plVar1 + 8);
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this->_M_use_count = this->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this->_M_use_count = this->_M_use_count + 1;
      }
    }
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"/Contents","");
    QPDFObjectHandle::getKey(local_50);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    QPDFObjectHandle::shallowCopy();
    if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"you can\'t see this",0x12);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    }
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
    return;
  }
  uVar2 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
  if (local_40[0] != (long *)unaff_R14) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  _Unwind_Resume(uVar2);
}

Assistant:

static void
test_21(QPDF& pdf, char const* arg2)
{
    // Try to shallow copy a stream
    std::vector<QPDFObjectHandle> const& pages = pdf.getAllPages();
    QPDFObjectHandle page = pages.at(0);
    QPDFObjectHandle contents = page.getKey("/Contents");
    contents.shallowCopy();
    std::cout << "you can't see this" << std::endl;
}